

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesVFManagementSetVFTelemetryModeExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flags,ze_bool_t enable)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar5 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zesVFManagementSetVFTelemetryModeExp(hVFhandle, flags, enable)",
             &local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar5 + 0xd00) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar5 + 0xd38) - *(long *)(lVar5 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar5 + 0xd00);
    do {
      if (lVar3 == lVar4) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesVFManagementSetVFTelemetryModeExpPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                                hVFhandle,flags,enable), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hVFhandle,flags,enable);
          lVar5 = 0;
          goto LAB_00173a58;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar4 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x8e0))(plVar1,hVFhandle,flags,enable);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00173a90;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x8e8))(plVar1,hVFhandle,flags,enable,zVar2);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00173a58:
    result = zVar2;
    if (lVar3 == lVar5) break;
  }
LAB_00173a90:
  logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementSetVFTelemetryModeExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        zes_vf_info_util_exp_flags_t flags,             ///< [in] utilization flags to enable or disable. May be 0 or a valid
                                                        ///< combination of ::zes_vf_info_util_exp_flag_t.
        ze_bool_t enable                                ///< [in] Enable utilization telemetry.
        )
    {
        context.logger->log_trace("zesVFManagementSetVFTelemetryModeExp(hVFhandle, flags, enable)");

        auto pfnSetVFTelemetryModeExp = context.zesDdiTable.VFManagementExp.pfnSetVFTelemetryModeExp;

        if( nullptr == pfnSetVFTelemetryModeExp )
            return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetryModeExpPrologue( hVFhandle, flags, enable );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesVFManagementSetVFTelemetryModeExpPrologue( hVFhandle, flags, enable );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }

        auto driver_result = pfnSetVFTelemetryModeExp( hVFhandle, flags, enable );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetryModeExpEpilogue( hVFhandle, flags, enable ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", result);
        }

        return logAndPropagateResult("zesVFManagementSetVFTelemetryModeExp", driver_result);
    }